

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O3

void Omega_h::find_rails(Mesh *mesh,LOs *keys2verts,Read<long> *verts2rail,LOs *rails2edges,
                        Read<signed_char> *rail_col_dirs)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Alloc *pAVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  LO size_in;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  Write<signed_char> rail_col_dirs_w;
  Write<int> rails2edges_w;
  Read<long> edge_globals;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  type f;
  Adj v2e;
  Write<signed_char> local_278;
  Write<int> local_268;
  string local_258;
  Alloc *local_238;
  element_type *local_230;
  Alloc *local_228;
  element_type *local_220;
  Alloc *local_218;
  element_type *local_210;
  Alloc *local_208;
  element_type *local_200;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  Write<signed_char> local_1d8;
  Write<int> local_1c8;
  Alloc *local_1b8;
  element_type *local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  element_type *peStack_1a0;
  Alloc *local_198;
  element_type *peStack_190;
  Alloc *local_188;
  element_type *peStack_180;
  Alloc *local_178;
  element_type *peStack_170;
  Alloc *local_168;
  element_type *peStack_160;
  Alloc *local_158;
  element_type *peStack_150;
  Alloc *local_148;
  element_type *peStack_140;
  Alloc *local_138;
  element_type *peStack_130;
  Alloc *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  Adj local_60;
  
  pAVar7 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar7 & 1) == 0) {
    uVar10 = pAVar7->size;
  }
  else {
    uVar10 = (ulong)pAVar7 >> 3;
  }
  local_118 = (element_type *)rail_col_dirs;
  Mesh::ask_up(&local_60,mesh,0,1);
  local_f0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  this_01._M_pi = local_f0._M_pi;
  local_e8 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_100._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  this_00._M_pi = local_100._M_pi;
  local_f8 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_110._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  this._M_pi = local_110._M_pi;
  local_108 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  paVar3 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar3;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rails2edges;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  size_in = (LO)(uVar10 >> 2);
  Write<int>::Write(&local_268,size_in,-1,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar3) {
    operator_delete(local_258._M_dataplus._M_p,(ulong)(local_258.field_2._M_allocated_capacity + 1))
    ;
  }
  local_258._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  Write<signed_char>::Write(&local_278,size_in,-1,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar3) {
    operator_delete(local_258._M_dataplus._M_p,(ulong)(local_258.field_2._M_allocated_capacity + 1))
    ;
  }
  Mesh::globals((Mesh *)&local_1b8,(Int)mesh);
  local_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_e0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_e0._M_pi)->use_count = ((Alloc *)local_e0._M_pi)->use_count + 1;
    }
  }
  local_d8 = (element_type *)(keys2verts->write_).shared_alloc_.direct_ptr;
  local_d0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(verts2rail->write_).shared_alloc_.alloc;
  if (((ulong)local_d0._M_pi & 7) == 0 && (Alloc *)local_d0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_d0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_d0._M_pi)->use_count = ((Alloc *)local_d0._M_pi)->use_count + 1;
    }
  }
  local_c8 = (element_type *)(verts2rail->write_).shared_alloc_.direct_ptr;
  local_c0._M_pi = this_01._M_pi;
  bVar14 = ((ulong)this_01._M_pi & 7) == 0;
  if (bVar14 && (Alloc *)this_01._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(this_01._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&this_01._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&this_01._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_b8 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_b0._M_pi = this_00._M_pi;
  bVar15 = ((ulong)this_00._M_pi & 7) == 0;
  if (bVar15 && (Alloc *)this_00._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(this_00._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&this_00._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&this_00._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a8 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_98 = local_1b0;
  local_90._M_pi = this._M_pi;
  bVar16 = ((ulong)this._M_pi & 7) == 0;
  if (bVar16 && (Alloc *)this._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(this._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&this._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&this._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_88 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_268.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_268.shared_alloc_.alloc)->use_count = (local_268.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78 = (element_type *)local_268.shared_alloc_.direct_ptr;
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.shared_alloc_.alloc;
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_278.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.shared_alloc_.alloc)->use_count = (local_278.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68 = (element_type *)local_278.shared_alloc_.direct_ptr;
  local_1a8._M_pi = local_e0._M_pi;
  if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_e0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_e0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_e0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_198 = (Alloc *)local_d0._M_pi;
  if (((ulong)local_d0._M_pi & 7) == 0 && (Alloc *)local_d0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)((long)(local_d0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_d0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_d0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_188 = (Alloc *)local_c0._M_pi;
  if (((ulong)local_c0._M_pi & 7) == 0 && (Alloc *)local_c0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)((long)(local_c0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_c0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_c0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  pAVar7 = local_188;
  peStack_180 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_178 = (Alloc *)local_b0._M_pi;
  if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)((long)(local_b0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_b0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_170 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_168 = (Alloc *)local_a0._M_pi;
  if (((ulong)local_a0._M_pi & 7) == 0 && (Alloc *)local_a0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)((long)(local_a0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_a0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_160 = local_1b0;
  local_158 = (Alloc *)local_90._M_pi;
  if (((ulong)local_90._M_pi & 7) == 0 && (Alloc *)local_90._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)((long)(local_90._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_90._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_90._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_150 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_148 = (Alloc *)local_80._M_pi;
  if (((ulong)local_80._M_pi & 7) == 0 && (Alloc *)local_80._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)((long)(local_80._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_140 = (element_type *)local_268.shared_alloc_.direct_ptr;
  local_138 = (Alloc *)local_70._M_pi;
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((long)(local_70._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_130 = (element_type *)local_278.shared_alloc_.direct_ptr;
  peStack_1a0 = local_d8;
  peStack_190 = local_c8;
  if (0 < size_in) {
    local_258._M_dataplus._M_p = (pointer)local_1a8._M_pi;
    if (((ulong)local_1a8._M_pi & 7) == 0 && (Alloc *)local_1a8._M_pi != (Alloc *)0x0) {
      *(int *)&local_1a8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1a8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_258._M_dataplus._M_p =
           (pointer)((long)(local_1a8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_1a0 = (element_type *)0x0;
    local_258.field_2._M_allocated_capacity = (size_type)local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      local_198->use_count = local_198->use_count + -1;
      local_258.field_2._M_allocated_capacity = local_198->size * 8 + 1;
    }
    local_198 = (Alloc *)0x0;
    peStack_190 = (element_type *)0x0;
    local_230 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_238 = local_188;
    if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
      local_188->use_count = local_188->use_count + -1;
      local_238 = (Alloc *)(local_188->size * 8 + 1);
    }
    local_188 = (Alloc *)0x0;
    peStack_180 = (element_type *)0x0;
    local_228 = local_178;
    local_220 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      local_178->use_count = local_178->use_count + -1;
      local_228 = (Alloc *)(local_178->size * 8 + 1);
    }
    local_178 = (Alloc *)0x0;
    peStack_170 = (element_type *)0x0;
    local_218 = local_168;
    local_210 = local_1b0;
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      local_168->use_count = local_168->use_count + -1;
      local_218 = (Alloc *)(local_168->size * 8 + 1);
    }
    local_168 = (Alloc *)0x0;
    peStack_160 = (element_type *)0x0;
    local_208 = local_158;
    local_200 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
      local_158->use_count = local_158->use_count + -1;
      local_208 = (Alloc *)(local_158->size * 8 + 1);
    }
    local_158 = (Alloc *)0x0;
    peStack_150 = (element_type *)0x0;
    local_1f0 = (element_type *)local_268.shared_alloc_.direct_ptr;
    local_1f8 = local_148;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      local_148->use_count = local_148->use_count + -1;
      local_1f8 = (Alloc *)(local_148->size * 8 + 1);
    }
    local_148 = (Alloc *)0x0;
    peStack_140 = (element_type *)0x0;
    local_1e0 = (element_type *)local_278.shared_alloc_.direct_ptr;
    local_1e8 = local_138;
    if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
      local_138->use_count = local_138->use_count + -1;
      local_1e8 = (Alloc *)(local_138->size * 8 + 1);
    }
    local_138 = (Alloc *)0x0;
    peStack_130 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar11 = 0;
    do {
      lVar13 = (long)*(int *)((long)&(local_d8->super_Graph).a2ab.write_.shared_alloc_.alloc +
                             lVar11 * 4);
      iVar5 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                              ->a2ab).write_.shared_alloc_.alloc + lVar13 * 4);
      lVar12 = (long)iVar5;
      iVar6 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                              ->a2ab).write_.shared_alloc_.alloc + lVar13 * 4 + 4);
      local_258._M_string_length = (size_type)local_d8;
      local_258.field_2._8_8_ = local_c8;
      local_128 = pAVar7;
      if (iVar6 <= iVar5) {
LAB_002676b8:
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
             ,0x67);
      }
      while (iVar5 = *(int *)((long)&(((Graph *)
                                      local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)->
                                     a2ab).write_.shared_alloc_.alloc + lVar12 * 4),
            (&local_1b0->library_)[iVar5] !=
            (Library *)(&(local_c8->super_Graph).a2ab.write_.shared_alloc_.alloc)[lVar13]) {
        lVar12 = lVar12 + 1;
        if (iVar6 == lVar12) goto LAB_002676b8;
      }
      cVar4 = *(char *)((long)&(((Graph *)local_60.codes.write_.shared_alloc_.direct_ptr)->a2ab).
                               write_.shared_alloc_.alloc + lVar12);
      *(int *)((long)&(((Graph *)local_268.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.
                      alloc + lVar11 * 4) = iVar5;
      *(char *)((long)&(((Graph *)local_278.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.
                       alloc + lVar11) = cVar4 >> 3;
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 != size_in);
    find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
    ::$_0::~__0((__0 *)&local_258);
  }
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&local_1a8);
  peVar9 = local_118;
  _Var8._M_pi = local_120._M_pi;
  local_1c8.shared_alloc_.alloc = local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.shared_alloc_.alloc = (Alloc *)((local_268.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_268.shared_alloc_.alloc)->use_count = (local_268.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1c8.shared_alloc_.direct_ptr = local_268.shared_alloc_.direct_ptr;
  Read<int>::Read((Read<signed_char> *)&local_258,&local_1c8);
  pAVar7 = (((Write<int> *)&(_Var8._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc;
  if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &pAVar7->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  (((Write<int> *)&(_Var8._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
       (Alloc *)local_258._M_dataplus._M_p;
  *(size_type *)&(_Var8._M_pi)->_M_use_count = local_258._M_string_length;
  if ((((ulong)local_258._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_258._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_258._M_dataplus._M_p + 0x30) = *(int *)(local_258._M_dataplus._M_p + 0x30) + -1;
    (((Write<int> *)&(_Var8._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
         (Alloc *)(*(long *)local_258._M_dataplus._M_p * 8 + 1);
  }
  pAVar7 = local_1c8.shared_alloc_.alloc;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_1d8.shared_alloc_.alloc = local_278.shared_alloc_.alloc;
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8.shared_alloc_.alloc = (Alloc *)((local_278.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.shared_alloc_.alloc)->use_count = (local_278.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1d8.shared_alloc_.direct_ptr = local_278.shared_alloc_.direct_ptr;
  Read<signed_char>::Read((Read<signed_char> *)&local_258,&local_1d8);
  pAVar7 = ((SharedAlloc *)&(peVar9->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &pAVar7->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  pAVar7 = local_1d8.shared_alloc_.alloc;
  ((SharedAlloc *)&(peVar9->super_Graph).a2ab)->alloc = (Alloc *)local_258._M_dataplus._M_p;
  ((SharedAlloc *)&(peVar9->super_Graph).a2ab)->direct_ptr = (void *)local_258._M_string_length;
  if ((((ulong)local_258._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_258._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_258._M_dataplus._M_p + 0x30) = *(int *)(local_258._M_dataplus._M_p + 0x30) + -1;
    ((SharedAlloc *)&(peVar9->super_Graph).a2ab)->alloc =
         (Alloc *)(*(long *)local_258._M_dataplus._M_p * 8 + 1);
  }
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1d8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d8.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&local_e0);
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    piVar1 = &local_1b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8);
      operator_delete(local_1b8,0x48);
    }
  }
  if (((ulong)local_278.shared_alloc_.alloc & 7) == 0 &&
      local_278.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.shared_alloc_.alloc);
      operator_delete(local_278.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.shared_alloc_.alloc);
      operator_delete(local_268.shared_alloc_.alloc,0x48);
    }
  }
  if (bVar16 && (Alloc *)this._M_pi != (Alloc *)0x0) {
    p_Var2 = this._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)this._M_pi);
      operator_delete(this._M_pi,0x48);
    }
  }
  if (bVar15 && (Alloc *)this_00._M_pi != (Alloc *)0x0) {
    p_Var2 = this_00._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)this_00._M_pi);
      operator_delete(this_00._M_pi,0x48);
    }
  }
  if (bVar14 && (Alloc *)this_01._M_pi != (Alloc *)0x0) {
    p_Var2 = this_01._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)this_01._M_pi);
      operator_delete(this_01._M_pi,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void find_rails(Mesh* mesh, LOs keys2verts, Read<GO> verts2rail,
    LOs* rails2edges, Read<I8>* rail_col_dirs) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto rails2edges_w = Write<LO>(nkeys, -1);
  auto rail_col_dirs_w = Write<I8>(nkeys, -1);
  auto edge_globals = mesh->globals(EDGE);
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto v = keys2verts[key];
    auto rail_global = verts2rail[v];
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto edge_global = edge_globals[e];
      if (edge_global == rail_global) {
        auto ve_code = ve_codes[ve];
        auto eev = code_which_down(ve_code);
        rails2edges_w[key] = e;
        rail_col_dirs_w[key] = static_cast<I8>(eev);
        return;
      }
    }
    OMEGA_H_NORETURN();
  };
  parallel_for(nkeys, f, "find_rails");
  *rails2edges = rails2edges_w;
  *rail_col_dirs = rail_col_dirs_w;
}